

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O1

DateFormat * __thiscall icu_63::DateFormat::operator=(DateFormat *this,DateFormat *other)

{
  int iVar1;
  undefined4 extraout_var;
  NumberFormat *pNVar3;
  Calendar *pCVar2;
  undefined4 extraout_var_00;
  
  if (this != other) {
    if (this->fCalendar != (Calendar *)0x0) {
      (*(this->fCalendar->super_UObject)._vptr_UObject[1])();
    }
    if (this->fNumberFormat != (NumberFormat *)0x0) {
      (*(this->fNumberFormat->super_Format).super_UObject._vptr_UObject[1])();
    }
    if (other->fCalendar == (Calendar *)0x0) {
      pCVar2 = (Calendar *)0x0;
    }
    else {
      iVar1 = (*(other->fCalendar->super_UObject)._vptr_UObject[3])();
      pCVar2 = (Calendar *)CONCAT44(extraout_var,iVar1);
    }
    this->fCalendar = pCVar2;
    if (other->fNumberFormat == (NumberFormat *)0x0) {
      pNVar3 = (NumberFormat *)0x0;
    }
    else {
      iVar1 = (*(other->fNumberFormat->super_Format).super_UObject._vptr_UObject[4])();
      pNVar3 = (NumberFormat *)CONCAT44(extraout_var_00,iVar1);
    }
    this->fNumberFormat = pNVar3;
    (this->fBoolFlags).fBools = (other->fBoolFlags).fBools;
    this->fCapitalizationContext = other->fCapitalizationContext;
  }
  return this;
}

Assistant:

DateFormat& DateFormat::operator=(const DateFormat& other)
{
    if (this != &other)
    {
        delete fCalendar;
        delete fNumberFormat;
        if(other.fCalendar) {
          fCalendar = other.fCalendar->clone();
        } else {
          fCalendar = NULL;
        }
        if(other.fNumberFormat) {
          fNumberFormat = (NumberFormat*)other.fNumberFormat->clone();
        } else {
          fNumberFormat = NULL;
        }
        fBoolFlags = other.fBoolFlags;
        fCapitalizationContext = other.fCapitalizationContext;
    }
    return *this;
}